

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# udata.cpp
# Opt level: O0

UDataMemory *
doOpenChoice(char *path,char *type,char *name,UDataMemoryIsAcceptable *isAcceptable,void *context,
            UErrorCode *pErrorCode)

{
  UBool UVar1;
  int iVar2;
  CharString *pCVar3;
  char *pcVar4;
  char *pcVar5;
  char *pcVar6;
  char *pcVar7;
  StringPiece s;
  StringPiece s_00;
  StringPiece s_01;
  StringPiece s_02;
  StringPiece s_03;
  StringPiece s_04;
  StringPiece s_05;
  StringPiece s_06;
  StringPiece s_07;
  StringPiece s_08;
  StringPiece s_09;
  StringPiece s_10;
  StringPiece s_11;
  char *tzFilesDir;
  undefined4 local_278;
  undefined1 local_270 [12];
  undefined1 local_260 [12];
  undefined1 local_250 [12];
  undefined1 local_240 [12];
  undefined1 local_230 [12];
  undefined1 local_220 [12];
  undefined1 local_210 [12];
  undefined1 local_200 [12];
  undefined1 local_1f0 [12];
  undefined1 local_1e0 [12];
  undefined1 local_1d0 [12];
  char *local_1c0;
  char *first;
  char *pkg;
  undefined4 local_1a8;
  undefined1 local_1a0 [8];
  CharString treeName;
  CharString pkgName;
  undefined1 local_110 [8];
  CharString tocEntryPath;
  CharString tocEntryName;
  int iStack_88;
  UBool isICUData;
  char *treeChar;
  char *pcStack_78;
  UErrorCode subErrorCode;
  char *tocEntryPathSuffix;
  char *pcStack_68;
  int32_t tocEntrySuffixIndex;
  char *dataPath;
  UDataMemory *retVal;
  UErrorCode *pErrorCode_local;
  void *context_local;
  UDataMemoryIsAcceptable *isAcceptable_local;
  char *name_local;
  char *type_local;
  char *path_local;
  
  dataPath = (char *)0x0;
  treeChar._4_4_ = U_ZERO_ERROR;
  tocEntryName._63_1_ = 0;
  retVal = (UDataMemory *)pErrorCode;
  pErrorCode_local = (UErrorCode *)context;
  context_local = isAcceptable;
  isAcceptable_local = (UDataMemoryIsAcceptable *)name;
  name_local = type;
  type_local = path;
  if ((((path == (char *)0x0) || (iVar2 = strcmp(path,"ICUDATA"), iVar2 == 0)) ||
      (iVar2 = strncmp(type_local,"icudt63l-",9), iVar2 == 0)) ||
     (iVar2 = strncmp(type_local,"ICUDATA-",8), iVar2 == 0)) {
    tocEntryName._63_1_ = 1;
  }
  icu_63::CharString::CharString((CharString *)&tocEntryPath.len);
  icu_63::CharString::CharString((CharString *)local_110);
  icu_63::CharString::CharString((CharString *)&treeName.len);
  icu_63::CharString::CharString((CharString *)local_1a0);
  if (type_local == (char *)0x0) {
    icu_63::StringPiece::StringPiece((StringPiece *)&pkg,"icudt63l");
    s._12_4_ = 0;
    s.ptr_ = pkg;
    s.length_ = local_1a8;
    icu_63::CharString::append((CharString *)&treeName.len,s,(UErrorCode *)retVal);
  }
  else {
    first = strrchr(type_local,0x2f);
    local_1c0 = strchr(type_local,0x2f);
    UVar1 = uprv_pathIsAbsolute_63(type_local);
    if ((UVar1 == '\0') && (first == local_1c0)) {
      pcVar4 = strchr(type_local,0x2d);
      if (pcVar4 == (char *)0x0) {
        if (tocEntryName._63_1_ == '\0') {
          icu_63::StringPiece::StringPiece((StringPiece *)local_220,type_local);
          s_05._12_4_ = 0;
          s_05.ptr_ = (char *)local_220._0_8_;
          s_05.length_ = local_220._8_4_;
          icu_63::CharString::append((CharString *)&treeName.len,s_05,(UErrorCode *)retVal);
        }
        else {
          icu_63::StringPiece::StringPiece((StringPiece *)local_210,"icudt63l");
          s_04._12_4_ = 0;
          s_04.ptr_ = (char *)local_210._0_8_;
          s_04.length_ = local_210._8_4_;
          icu_63::CharString::append((CharString *)&treeName.len,s_04,(UErrorCode *)retVal);
        }
      }
      else {
        icu_63::StringPiece::StringPiece((StringPiece *)local_1f0,pcVar4 + 1);
        s_02._12_4_ = 0;
        s_02.ptr_ = (char *)local_1f0._0_8_;
        s_02.length_ = local_1f0._8_4_;
        icu_63::CharString::append((CharString *)local_1a0,s_02,(UErrorCode *)retVal);
        if (tocEntryName._63_1_ == '\0') {
          iStack_88 = (int)pcVar4;
          icu_63::CharString::append
                    ((CharString *)&treeName.len,type_local,iStack_88 - (int)type_local,
                     (UErrorCode *)retVal);
          if (local_1c0 == (char *)0x0) {
            type_local = icu_63::CharString::data((CharString *)&treeName.len);
          }
        }
        else {
          icu_63::StringPiece::StringPiece((StringPiece *)local_200,"icudt63l");
          s_03._12_4_ = 0;
          s_03.ptr_ = (char *)local_200._0_8_;
          s_03.length_ = local_200._8_4_;
          icu_63::CharString::append((CharString *)&treeName.len,s_03,(UErrorCode *)retVal);
        }
      }
    }
    else if (first == (char *)0x0) {
      icu_63::StringPiece::StringPiece((StringPiece *)local_1e0,type_local);
      s_01._12_4_ = 0;
      s_01.ptr_ = (char *)local_1e0._0_8_;
      s_01.length_ = local_1e0._8_4_;
      icu_63::CharString::append((CharString *)&treeName.len,s_01,(UErrorCode *)retVal);
    }
    else {
      icu_63::StringPiece::StringPiece((StringPiece *)local_1d0,first + 1);
      s_00._12_4_ = 0;
      s_00.ptr_ = (char *)local_1d0._0_8_;
      s_00.length_ = local_1d0._8_4_;
      icu_63::CharString::append((CharString *)&treeName.len,s_00,(UErrorCode *)retVal);
    }
  }
  icu_63::CharString::append
            ((CharString *)&tocEntryPath.len,(CharString *)&treeName.len,(UErrorCode *)retVal);
  icu_63::CharString::append
            ((CharString *)local_110,(CharString *)&treeName.len,(UErrorCode *)retVal);
  tocEntryPathSuffix._4_4_ = icu_63::CharString::length((CharString *)&tocEntryPath.len);
  UVar1 = icu_63::CharString::isEmpty((CharString *)local_1a0);
  if (UVar1 == '\0') {
    pCVar3 = icu_63::CharString::append((CharString *)&tocEntryPath.len,'/',(UErrorCode *)retVal);
    icu_63::CharString::append(pCVar3,(CharString *)local_1a0,(UErrorCode *)retVal);
    pCVar3 = icu_63::CharString::append((CharString *)local_110,'/',(UErrorCode *)retVal);
    icu_63::CharString::append(pCVar3,(CharString *)local_1a0,(UErrorCode *)retVal);
  }
  pCVar3 = icu_63::CharString::append((CharString *)&tocEntryPath.len,'/',(UErrorCode *)retVal);
  icu_63::StringPiece::StringPiece((StringPiece *)local_230,(char *)isAcceptable_local);
  s_06._12_4_ = 0;
  s_06.ptr_ = (char *)local_230._0_8_;
  s_06.length_ = local_230._8_4_;
  icu_63::CharString::append(pCVar3,s_06,(UErrorCode *)retVal);
  pCVar3 = icu_63::CharString::append((CharString *)local_110,'/',(UErrorCode *)retVal);
  icu_63::StringPiece::StringPiece((StringPiece *)local_240,(char *)isAcceptable_local);
  s_07._12_4_ = 0;
  s_07.ptr_ = (char *)local_240._0_8_;
  s_07.length_ = local_240._8_4_;
  icu_63::CharString::append(pCVar3,s_07,(UErrorCode *)retVal);
  if ((name_local != (char *)0x0) && (*name_local != '\0')) {
    icu_63::StringPiece::StringPiece((StringPiece *)local_250,".");
    s_08._12_4_ = 0;
    s_08.ptr_ = (char *)local_250._0_8_;
    s_08.length_ = local_250._8_4_;
    pCVar3 = icu_63::CharString::append((CharString *)&tocEntryPath.len,s_08,(UErrorCode *)retVal);
    icu_63::StringPiece::StringPiece((StringPiece *)local_260,name_local);
    s_09._12_4_ = 0;
    s_09.ptr_ = (char *)local_260._0_8_;
    s_09.length_ = local_260._8_4_;
    icu_63::CharString::append(pCVar3,s_09,(UErrorCode *)retVal);
    icu_63::StringPiece::StringPiece((StringPiece *)local_270,".");
    s_10._12_4_ = 0;
    s_10.ptr_ = (char *)local_270._0_8_;
    s_10.length_ = local_270._8_4_;
    pCVar3 = icu_63::CharString::append((CharString *)local_110,s_10,(UErrorCode *)retVal);
    icu_63::StringPiece::StringPiece((StringPiece *)&tzFilesDir,name_local);
    s_11._12_4_ = 0;
    s_11.ptr_ = tzFilesDir;
    s_11.length_ = local_278;
    icu_63::CharString::append(pCVar3,s_11,(UErrorCode *)retVal);
  }
  pcStack_78 = icu_63::CharString::data((CharString *)local_110);
  pcStack_78 = pcStack_78 + (long)tocEntryPathSuffix._4_4_ + 1;
  if (type_local == (char *)0x0) {
    type_local = "icudt63l";
  }
  pcStack_68 = u_getDataDirectory_63();
  if ((((tocEntryName._63_1_ == '\0') ||
       (UVar1 = isTimeZoneFile((char *)isAcceptable_local,name_local), UVar1 == '\0')) ||
      (pcVar4 = u_getTimeZoneFilesDirectory_63((UErrorCode *)retVal), *pcVar4 == '\0')) ||
     ((dataPath = (char *)doLoadFromIndividualFiles
                                    ("",pcVar4,pcStack_78,"",name_local,(char *)isAcceptable_local,
                                     (UDataMemoryIsAcceptable *)context_local,pErrorCode_local,
                                     (UErrorCode *)((long)&treeChar + 4),(UErrorCode *)retVal),
      (UDataMemory *)dataPath == (UDataMemory *)0x0 &&
      (UVar1 = U_FAILURE(*(UErrorCode *)&retVal->vFuncs), UVar1 == '\0')))) {
    if (gDataFileAccess == UDATA_PACKAGES_FIRST) {
      pcVar5 = icu_63::CharString::data((CharString *)&treeName.len);
      pcVar7 = pcStack_68;
      pcVar4 = pcStack_78;
      pcVar6 = icu_63::CharString::data((CharString *)&tocEntryPath.len);
      dataPath = (char *)doLoadFromCommonData
                                   (tocEntryName._63_1_,pcVar5,pcVar7,pcVar4,pcVar6,type_local,
                                    name_local,(char *)isAcceptable_local,
                                    (UDataMemoryIsAcceptable *)context_local,pErrorCode_local,
                                    (UErrorCode *)((long)&treeChar + 4),(UErrorCode *)retVal);
      if (((UDataMemory *)dataPath != (UDataMemory *)0x0) ||
         (UVar1 = U_FAILURE(*(UErrorCode *)&retVal->vFuncs), UVar1 != '\0')) {
        path_local = dataPath;
        goto LAB_003689d5;
      }
    }
    if (((gDataFileAccess == UDATA_PACKAGES_FIRST) || (gDataFileAccess == UDATA_DEFAULT_ACCESS)) &&
       (((pcStack_68 != (char *)0x0 && (*pcStack_68 != '\0')) || (tocEntryName._63_1_ == '\0')))) {
      pcVar4 = icu_63::CharString::data((CharString *)&treeName.len);
      dataPath = (char *)doLoadFromIndividualFiles
                                   (pcVar4,pcStack_68,pcStack_78,type_local,name_local,
                                    (char *)isAcceptable_local,
                                    (UDataMemoryIsAcceptable *)context_local,pErrorCode_local,
                                    (UErrorCode *)((long)&treeChar + 4),(UErrorCode *)retVal);
      if (((UDataMemory *)dataPath != (UDataMemory *)0x0) ||
         (UVar1 = U_FAILURE(*(UErrorCode *)&retVal->vFuncs), UVar1 != '\0')) {
        path_local = dataPath;
        goto LAB_003689d5;
      }
    }
    if ((gDataFileAccess == UDATA_ONLY_PACKAGES) || (gDataFileAccess == UDATA_DEFAULT_ACCESS)) {
      pcVar5 = icu_63::CharString::data((CharString *)&treeName.len);
      pcVar7 = pcStack_68;
      pcVar4 = pcStack_78;
      pcVar6 = icu_63::CharString::data((CharString *)&tocEntryPath.len);
      dataPath = (char *)doLoadFromCommonData
                                   (tocEntryName._63_1_,pcVar5,pcVar7,pcVar4,pcVar6,type_local,
                                    name_local,(char *)isAcceptable_local,
                                    (UDataMemoryIsAcceptable *)context_local,pErrorCode_local,
                                    (UErrorCode *)((long)&treeChar + 4),(UErrorCode *)retVal);
      if (((UDataMemory *)dataPath != (UDataMemory *)0x0) ||
         (UVar1 = U_FAILURE(*(UErrorCode *)&retVal->vFuncs), UVar1 != '\0')) {
        path_local = dataPath;
        goto LAB_003689d5;
      }
    }
    if (gDataFileAccess == UDATA_NO_FILES) {
      pcVar7 = icu_63::CharString::data((CharString *)&treeName.len);
      pcVar4 = pcStack_78;
      pcVar5 = icu_63::CharString::data((CharString *)&tocEntryPath.len);
      dataPath = (char *)doLoadFromCommonData
                                   (tocEntryName._63_1_,pcVar7,"",pcVar4,pcVar5,type_local,
                                    name_local,(char *)isAcceptable_local,
                                    (UDataMemoryIsAcceptable *)context_local,pErrorCode_local,
                                    (UErrorCode *)((long)&treeChar + 4),(UErrorCode *)retVal);
      if (((UDataMemory *)dataPath != (UDataMemory *)0x0) ||
         (UVar1 = U_FAILURE(*(UErrorCode *)&retVal->vFuncs), UVar1 != '\0')) {
        path_local = dataPath;
        goto LAB_003689d5;
      }
    }
    UVar1 = U_SUCCESS(*(UErrorCode *)&retVal->vFuncs);
    if (UVar1 != '\0') {
      UVar1 = U_SUCCESS(treeChar._4_4_);
      if (UVar1 == '\0') {
        *(UErrorCode *)&retVal->vFuncs = treeChar._4_4_;
      }
      else {
        *(undefined4 *)&retVal->vFuncs = 4;
      }
    }
    path_local = dataPath;
  }
  else {
    path_local = dataPath;
  }
LAB_003689d5:
  dataPath = path_local;
  icu_63::CharString::~CharString((CharString *)local_1a0);
  icu_63::CharString::~CharString((CharString *)&treeName.len);
  icu_63::CharString::~CharString((CharString *)local_110);
  icu_63::CharString::~CharString((CharString *)&tocEntryPath.len);
  return (UDataMemory *)path_local;
}

Assistant:

static UDataMemory *
doOpenChoice(const char *path, const char *type, const char *name,
             UDataMemoryIsAcceptable *isAcceptable, void *context,
             UErrorCode *pErrorCode)
{
    UDataMemory         *retVal = NULL;

    const char         *dataPath;

    int32_t             tocEntrySuffixIndex;
    const char         *tocEntryPathSuffix;
    UErrorCode          subErrorCode=U_ZERO_ERROR;
    const char         *treeChar;

    UBool               isICUData = FALSE;


    /* Is this path ICU data? */
    if(path == NULL ||
       !strcmp(path, U_ICUDATA_ALIAS) ||  /* "ICUDATA" */
       !uprv_strncmp(path, U_ICUDATA_NAME U_TREE_SEPARATOR_STRING, /* "icudt26e-" */
                     uprv_strlen(U_ICUDATA_NAME U_TREE_SEPARATOR_STRING)) ||  
       !uprv_strncmp(path, U_ICUDATA_ALIAS U_TREE_SEPARATOR_STRING, /* "ICUDATA-" */
                     uprv_strlen(U_ICUDATA_ALIAS U_TREE_SEPARATOR_STRING))) {
      isICUData = TRUE;
    }

#if (U_FILE_SEP_CHAR != U_FILE_ALT_SEP_CHAR)  /* Windows:  try "foo\bar" and "foo/bar" */
    /* remap from alternate path char to the main one */
    CharString altSepPath;
    if(path) {
        if(uprv_strchr(path,U_FILE_ALT_SEP_CHAR) != NULL) {
            altSepPath.append(path, *pErrorCode);
            char *p;
            while ((p = uprv_strchr(altSepPath.data(), U_FILE_ALT_SEP_CHAR)) != NULL) {
                *p = U_FILE_SEP_CHAR;
            }
#if defined (UDATA_DEBUG)
            fprintf(stderr, "Changed path from [%s] to [%s]\n", path, altSepPath.s);
#endif
            path = altSepPath.data();
        }
    }
#endif

    CharString tocEntryName; /* entry name in tree format. ex:  'icudt28b/coll/ar.res' */
    CharString tocEntryPath; /* entry name in path format. ex:  'icudt28b\\coll\\ar.res' */

    CharString pkgName;
    CharString treeName;

    /* ======= Set up strings */
    if(path==NULL) {
        pkgName.append(U_ICUDATA_NAME, *pErrorCode);
    } else {
        const char *pkg;
        const char *first;
        pkg = uprv_strrchr(path, U_FILE_SEP_CHAR);
        first = uprv_strchr(path, U_FILE_SEP_CHAR);
        if(uprv_pathIsAbsolute(path) || (pkg != first)) { /* more than one slash in the path- not a tree name */
            /* see if this is an /absolute/path/to/package  path */
            if(pkg) {
                pkgName.append(pkg+1, *pErrorCode);
            } else {
                pkgName.append(path, *pErrorCode);
            }
        } else {
            treeChar = uprv_strchr(path, U_TREE_SEPARATOR);
            if(treeChar) { 
                treeName.append(treeChar+1, *pErrorCode); /* following '-' */
                if(isICUData) {
                    pkgName.append(U_ICUDATA_NAME, *pErrorCode);
                } else {
                    pkgName.append(path, (int32_t)(treeChar-path), *pErrorCode);
                    if (first == NULL) {
                        /*
                        This user data has no path, but there is a tree name.
                        Look up the correct path from the data cache later.
                        */
                        path = pkgName.data();
                    }
                }
            } else {
                if(isICUData) {
                    pkgName.append(U_ICUDATA_NAME, *pErrorCode);
                } else {
                    pkgName.append(path, *pErrorCode);
                }
            }
        }
    }

#ifdef UDATA_DEBUG
    fprintf(stderr, " P=%s T=%s\n", pkgName.data(), treeName.data());
#endif

    /* setting up the entry name and file name 
     * Make up a full name by appending the type to the supplied
     *  name, assuming that a type was supplied.
     */

    /* prepend the package */
    tocEntryName.append(pkgName, *pErrorCode);
    tocEntryPath.append(pkgName, *pErrorCode);
    tocEntrySuffixIndex = tocEntryName.length();

    if(!treeName.isEmpty()) {
        tocEntryName.append(U_TREE_ENTRY_SEP_CHAR, *pErrorCode).append(treeName, *pErrorCode);
        tocEntryPath.append(U_FILE_SEP_CHAR, *pErrorCode).append(treeName, *pErrorCode);
    }

    tocEntryName.append(U_TREE_ENTRY_SEP_CHAR, *pErrorCode).append(name, *pErrorCode);
    tocEntryPath.append(U_FILE_SEP_CHAR, *pErrorCode).append(name, *pErrorCode);
    if(type!=NULL && *type!=0) {
        tocEntryName.append(".", *pErrorCode).append(type, *pErrorCode);
        tocEntryPath.append(".", *pErrorCode).append(type, *pErrorCode);
    }
    // The +1 is for the U_FILE_SEP_CHAR that is always appended above.
    tocEntryPathSuffix = tocEntryPath.data() + tocEntrySuffixIndex + 1; /* suffix starts here */

#ifdef UDATA_DEBUG
    fprintf(stderr, " tocEntryName = %s\n", tocEntryName.data());
    fprintf(stderr, " tocEntryPath = %s\n", tocEntryName.data());
#endif

#if U_PLATFORM_HAS_WINUWP_API == 0 // Windows UWP Platform does not support dll icu data at this time
    if(path == NULL) {
        path = COMMON_DATA_NAME; /* "icudt26e" */
    }
#else
    // Windows UWP expects only a single data file.
    path = COMMON_DATA_NAME; /* "icudt26e" */
#endif

    /************************ Begin loop looking for ind. files ***************/
#ifdef UDATA_DEBUG
    fprintf(stderr, "IND: inBasename = %s, pkg=%s\n", "(n/a)", packageNameFromPath(path));
#endif

    /* End of dealing with a null basename */
    dataPath = u_getDataDirectory();

    /****    Time zone individual files override  */
    if (isICUData && isTimeZoneFile(name, type)) {
        const char *tzFilesDir = u_getTimeZoneFilesDirectory(pErrorCode);
        if (tzFilesDir[0] != 0) {
#ifdef UDATA_DEBUG
            fprintf(stderr, "Trying Time Zone Files directory = %s\n", tzFilesDir);
#endif
            retVal = doLoadFromIndividualFiles(/* pkgName.data() */ "", tzFilesDir, tocEntryPathSuffix,
                            /* path */ "", type, name, isAcceptable, context, &subErrorCode, pErrorCode);
            if((retVal != NULL) || U_FAILURE(*pErrorCode)) {
                return retVal;
            }
        }
    }

    /****    COMMON PACKAGE  - only if packages are first. */
    if(gDataFileAccess == UDATA_PACKAGES_FIRST) {
#ifdef UDATA_DEBUG
        fprintf(stderr, "Trying packages (UDATA_PACKAGES_FIRST)\n");
#endif
        /* #2 */
        retVal = doLoadFromCommonData(isICUData, 
                            pkgName.data(), dataPath, tocEntryPathSuffix, tocEntryName.data(),
                            path, type, name, isAcceptable, context, &subErrorCode, pErrorCode);
        if((retVal != NULL) || U_FAILURE(*pErrorCode)) {
            return retVal;
        }
    }

    /****    INDIVIDUAL FILES  */
    if((gDataFileAccess==UDATA_PACKAGES_FIRST) ||
       (gDataFileAccess==UDATA_FILES_FIRST)) {
#ifdef UDATA_DEBUG
        fprintf(stderr, "Trying individual files\n");
#endif
        /* Check to make sure that there is a dataPath to iterate over */
        if ((dataPath && *dataPath) || !isICUData) {
            retVal = doLoadFromIndividualFiles(pkgName.data(), dataPath, tocEntryPathSuffix,
                            path, type, name, isAcceptable, context, &subErrorCode, pErrorCode);
            if((retVal != NULL) || U_FAILURE(*pErrorCode)) {
                return retVal;
            }
        }
    }

    /****    COMMON PACKAGE  */
    if((gDataFileAccess==UDATA_ONLY_PACKAGES) || 
       (gDataFileAccess==UDATA_FILES_FIRST)) {
#ifdef UDATA_DEBUG
        fprintf(stderr, "Trying packages (UDATA_ONLY_PACKAGES || UDATA_FILES_FIRST)\n");
#endif
        retVal = doLoadFromCommonData(isICUData,
                            pkgName.data(), dataPath, tocEntryPathSuffix, tocEntryName.data(),
                            path, type, name, isAcceptable, context, &subErrorCode, pErrorCode);
        if((retVal != NULL) || U_FAILURE(*pErrorCode)) {
            return retVal;
        }
    }
    
    /* Load from DLL.  If we haven't attempted package load, we also haven't had any chance to
        try a DLL (static or setCommonData/etc)  load.
         If we ever have a "UDATA_ONLY_FILES", add it to the or list here.  */  
    if(gDataFileAccess==UDATA_NO_FILES) {
#ifdef UDATA_DEBUG
        fprintf(stderr, "Trying common data (UDATA_NO_FILES)\n");
#endif
        retVal = doLoadFromCommonData(isICUData,
                            pkgName.data(), "", tocEntryPathSuffix, tocEntryName.data(),
                            path, type, name, isAcceptable, context, &subErrorCode, pErrorCode);
        if((retVal != NULL) || U_FAILURE(*pErrorCode)) {
            return retVal;
        }
    }

    /* data not found */
    if(U_SUCCESS(*pErrorCode)) {
        if(U_SUCCESS(subErrorCode)) {
            /* file not found */
            *pErrorCode=U_FILE_ACCESS_ERROR;
        } else {
            /* entry point not found or rejected */
            *pErrorCode=subErrorCode;
        }
    }
    return retVal;
}